

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_deviate(lysp_yin_ctx *ctx,lysp_deviate **deviates)

{
  lysp_deviate *plVar1;
  int iVar2;
  ly_ctx *local_320;
  long *local_318;
  char **iter__;
  size_t offset__;
  yin_subelement subelems_3 [5];
  undefined1 local_288 [8];
  yin_subelement subelems_2 [8];
  minmax_dev_meta max_1;
  minmax_dev_meta min_1;
  yin_subelement subelems_1 [9];
  uint32_t *local_b8;
  minmax_dev_meta max;
  minmax_dev_meta min;
  yin_subelement subelems [1];
  LY_ERR ret___1;
  LY_ERR ret__;
  lysp_deviate_del *d_del;
  lysp_deviate_rpl *d_rpl;
  lysp_deviate_add *d_add;
  lysp_deviate *d;
  char *temp_val;
  uint8_t dev_mod;
  lysp_deviate **pplStack_30;
  LY_ERR ret;
  lysp_deviate **deviates_local;
  lysp_yin_ctx *ctx_local;
  
  temp_val._4_4_ = 0;
  pplStack_30 = deviates;
  deviates_local = (lysp_deviate **)ctx;
  ctx_local._4_4_ = lyxml_ctx_next(ctx->xmlctx);
  if ((ctx_local._4_4_ == LY_SUCCESS) &&
     (ctx_local._4_4_ =
           yin_parse_attribute((lysp_yin_ctx *)deviates_local,YIN_ARG_VALUE,(char **)&d,Y_STR_ARG,
                               LY_STMT_DEVIATE), ctx_local._4_4_ == LY_SUCCESS)) {
    iVar2 = strcmp((char *)d,"not-supported");
    if (iVar2 == 0) {
      temp_val._3_1_ = '\x01';
    }
    else {
      iVar2 = strcmp((char *)d,"add");
      if (iVar2 == 0) {
        temp_val._3_1_ = '\x02';
      }
      else {
        iVar2 = strcmp((char *)d,"replace");
        if (iVar2 == 0) {
          temp_val._3_1_ = '\x04';
        }
        else {
          iVar2 = strcmp((char *)d,"delete");
          if (iVar2 != 0) {
            if (deviates_local == (lysp_deviate **)0x0) {
              local_320 = (ly_ctx *)0x0;
            }
            else {
              local_320 = *(ly_ctx **)
                           **(undefined8 **)
                             (&deviates_local[7]->next->mod +
                             (ulong)(*(int *)&deviates_local[7]->field_0x4 - 1) * 8);
            }
            ly_vlog(local_320,(char *)0x0,LYVE_SYNTAX_YIN,
                    "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Valid values are \"%s\", \"%s\", \"%s\" and \"%s\"."
                    ,d,"value","deviate","not-supported","add","replace","delete");
            lydict_remove(*(ly_ctx **)deviates_local[9],(char *)d);
            return LY_EVALID;
          }
          temp_val._3_1_ = '\x03';
        }
      }
    }
    lydict_remove(*(ly_ctx **)deviates_local[9],(char *)d);
    if (temp_val._3_1_ == '\x01') {
      d_add = (lysp_deviate_add *)calloc(1,0x18);
      if (d_add == (lysp_deviate_add *)0x0) {
        ly_log(*(ly_ctx **)deviates_local[9],LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "yin_parse_deviate");
        return LY_EMEM;
      }
      min.exts = (lysp_ext_instance **)0xf0000;
      temp_val._4_4_ =
           yin_parse_content((lysp_yin_ctx *)deviates_local,(yin_subelement *)&min.exts,1,d_add,
                             LY_STMT_DEVIATE,(char **)0x0,&d_add->exts);
    }
    else if (temp_val._3_1_ == '\x02') {
      d_add = (lysp_deviate_add *)calloc(1,0x48);
      if (d_add == (lysp_deviate_add *)0x0) {
        ly_log(*(ly_ctx **)deviates_local[9],LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "yin_parse_deviate");
        return LY_EMEM;
      }
      max.exts = (lysp_ext_instance **)&d_add->min;
      min.lim = (uint32_t *)&d_add->flags;
      min.flags = (uint16_t *)&d_add->exts;
      local_b8 = &d_add->max;
      max.lim = (uint32_t *)&d_add->flags;
      max.flags = (uint16_t *)&d_add->exts;
      min_1.exts._0_4_ = 0x50000;
      subelems_1[0]._0_8_ = &d_add->flags;
      subelems_1[0].dest._0_2_ = 2;
      subelems_1[0].flags = 0;
      subelems_1[0]._18_2_ = 7;
      subelems_1[1]._0_8_ = &d_add->dflts;
      subelems_1[1].dest._0_2_ = 0;
      subelems_1[1].flags = 0;
      subelems_1[1]._18_2_ = 0x18;
      subelems_1[2]._0_8_ = &d_add->flags;
      subelems_1[2].dest._0_2_ = 2;
      subelems_1[2].flags = 0;
      subelems_1[2]._18_2_ = 0x19;
      subelems_1[3]._0_8_ = &local_b8;
      subelems_1[3].dest._0_2_ = 2;
      subelems_1[3].flags = 0;
      subelems_1[3]._18_2_ = 0x1a;
      subelems_1[4]._0_8_ = &max.exts;
      subelems_1[4].dest._0_2_ = 2;
      subelems_1[4].flags = 0;
      subelems_1[4]._18_2_ = 0x1d;
      subelems_1[5]._0_8_ = &d_add->musts;
      subelems_1[5].dest._0_2_ = 0;
      subelems_1[5].flags = 0;
      subelems_1[5]._18_2_ = 0x30;
      subelems_1[6]._0_8_ = &d_add->uniques;
      subelems_1[6].dest._0_2_ = 0;
      subelems_1[6].flags = 0;
      subelems_1[6]._18_2_ = 0x31;
      subelems_1[7]._0_8_ = &d_add->units;
      subelems_1[7].dest._0_2_ = 2;
      memset(&subelems_1[7].flags,0,0x18);
      subelems_1[7].flags = 0;
      subelems_1[7]._18_2_ = 0xf;
      temp_val._4_4_ =
           yin_parse_content((lysp_yin_ctx *)deviates_local,(yin_subelement *)&min_1.exts,9,d_add,
                             LY_STMT_DEVIATE,(char **)0x0,&d_add->exts);
    }
    else if (temp_val._3_1_ == '\x04') {
      d_add = (lysp_deviate_add *)calloc(1,0x50);
      if (d_add == (lysp_deviate_add *)0x0) {
        ly_log(*(ly_ctx **)deviates_local[9],LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "yin_parse_deviate");
        return LY_EMEM;
      }
      max_1.exts = (lysp_ext_instance **)&d_add->field_0x44;
      min_1.lim = &d_add->max;
      min_1.flags = (uint16_t *)&d_add->exts;
      subelems_2[7]._16_8_ = d_add + 1;
      max_1.lim = &d_add->max;
      max_1.flags = (uint16_t *)&d_add->exts;
      local_288._0_4_ = LY_STMT_CONFIG;
      subelems_2[0]._0_8_ = &d_add->max;
      subelems_2[0].dest._0_2_ = 2;
      subelems_2[0].flags = 0;
      subelems_2[0]._18_2_ = 7;
      subelems_2[1]._0_8_ = &d_add->uniques;
      subelems_2[1].dest._0_2_ = 2;
      subelems_2[1].flags = 0;
      subelems_2[1]._18_2_ = 0x18;
      subelems_2[2]._0_8_ = &d_add->max;
      subelems_2[2].dest._0_2_ = 2;
      subelems_2[2].flags = 0;
      subelems_2[2]._18_2_ = 0x19;
      subelems_2[3]._0_8_ = &subelems_2[7].flags;
      subelems_2[3].dest._0_2_ = 2;
      subelems_2[3].flags = 0;
      subelems_2[3]._18_2_ = 0x1a;
      subelems_2[4]._0_8_ = &max_1.exts;
      subelems_2[4].dest._0_2_ = 2;
      subelems_2[4].flags = 0;
      subelems_2[4]._18_2_ = 0x2e;
      subelems_2[5]._0_8_ = &d_add->units;
      subelems_2[5].dest._0_2_ = 2;
      subelems_2[5].flags = 0;
      subelems_2[5]._18_2_ = 0x31;
      subelems_2[6]._0_8_ = &d_add->musts;
      subelems_2[6].dest._0_2_ = 2;
      memset(&subelems_2[6].flags,0,0x18);
      subelems_2[6].flags = 0;
      subelems_2[6]._18_2_ = 0xf;
      temp_val._4_4_ =
           yin_parse_content((lysp_yin_ctx *)deviates_local,(yin_subelement *)local_288,8,d_add,
                             LY_STMT_DEVIATE,(char **)0x0,&d_add->exts);
    }
    else {
      d_add = (lysp_deviate_add *)calloc(1,0x38);
      if (d_add == (lysp_deviate_add *)0x0) {
        ly_log(*(ly_ctx **)deviates_local[9],LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "yin_parse_deviate");
        return LY_EMEM;
      }
      offset__._0_4_ = 0x70000;
      subelems_3[0]._0_8_ = &d_add->dflts;
      subelems_3[0].dest._0_2_ = 0;
      subelems_3[0].flags = 0;
      subelems_3[0]._18_2_ = 0x1d;
      subelems_3[1]._0_8_ = &d_add->musts;
      subelems_3[1].dest._0_2_ = 0;
      subelems_3[1].flags = 0;
      subelems_3[1]._18_2_ = 0x30;
      subelems_3[2]._0_8_ = &d_add->uniques;
      subelems_3[2].dest._0_2_ = 0;
      subelems_3[2].flags = 0;
      subelems_3[2]._18_2_ = 0x31;
      subelems_3[3]._0_8_ = &d_add->units;
      subelems_3[3].dest._0_2_ = 2;
      memset(&subelems_3[3].flags,0,0x18);
      subelems_3[3].flags = 0;
      subelems_3[3]._18_2_ = 0xf;
      temp_val._4_4_ =
           yin_parse_content((lysp_yin_ctx *)deviates_local,(yin_subelement *)&offset__,5,d_add,
                             LY_STMT_DEVIATE,(char **)0x0,&d_add->exts);
    }
    if ((temp_val._4_4_ == LY_SUCCESS) &&
       (temp_val._4_4_ = yin_unres_exts_add((lysp_yin_ctx *)deviates_local,d_add->exts),
       temp_val._4_4_ == LY_SUCCESS)) {
      d_add->mod = temp_val._3_1_;
      ctx_local._4_4_ = temp_val._4_4_;
      if (*pplStack_30 == (lysp_deviate *)0x0) {
        *pplStack_30 = (lysp_deviate *)d_add;
      }
      else {
        plVar1 = *pplStack_30;
        while (local_318 = (long *)((long)plVar1 + (long)*pplStack_30 + (8 - (long)*pplStack_30)),
              *local_318 != 0) {
          plVar1 = (lysp_deviate *)*local_318;
        }
        *local_318 = (long)d_add;
      }
    }
    else {
      free(d_add);
      ctx_local._4_4_ = temp_val._4_4_;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_deviate(struct lysp_yin_ctx *ctx, struct lysp_deviate **deviates)
{
    LY_ERR ret = LY_SUCCESS;
    uint8_t dev_mod;
    const char *temp_val;
    struct lysp_deviate *d;
    struct lysp_deviate_add *d_add = NULL;
    struct lysp_deviate_rpl *d_rpl = NULL;
    struct lysp_deviate_del *d_del = NULL;

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_VALUE, &temp_val, Y_STR_ARG, LY_STMT_DEVIATE));

    if (strcmp(temp_val, "not-supported") == 0) {
        dev_mod = LYS_DEV_NOT_SUPPORTED;
    } else if (strcmp(temp_val, "add") == 0) {
        dev_mod = LYS_DEV_ADD;
    } else if (strcmp(temp_val, "replace") == 0) {
        dev_mod = LYS_DEV_REPLACE;
    } else if (strcmp(temp_val, "delete") == 0) {
        dev_mod = LYS_DEV_DELETE;
    } else {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INVAL_YIN VALID_VALS4, temp_val, "value", "deviate",
                "not-supported", "add", "replace", "delete");
        lydict_remove(ctx->xmlctx->ctx, temp_val);
        return LY_EVALID;
    }
    lydict_remove(ctx->xmlctx->ctx, temp_val);

    if (dev_mod == LYS_DEV_NOT_SUPPORTED) {
        d = calloc(1, sizeof *d);
        LY_CHECK_ERR_RET(!d, LOGMEM(ctx->xmlctx->ctx), LY_EMEM);
        struct yin_subelement subelems[] = {
            {LY_STMT_EXTENSION_INSTANCE, NULL, 0}
        };

        ret = yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), d, LY_STMT_DEVIATE, NULL, &d->exts);

    } else if (dev_mod == LYS_DEV_ADD) {
        d_add = calloc(1, sizeof *d_add);
        LY_CHECK_ERR_RET(!d_add, LOGMEM(ctx->xmlctx->ctx), LY_EMEM);
        d = (struct lysp_deviate *)d_add;
        struct minmax_dev_meta min = {&d_add->min, &d_add->flags, &d_add->exts};
        struct minmax_dev_meta max = {&d_add->max, &d_add->flags, &d_add->exts};
        struct yin_subelement subelems[] = {
            {LY_STMT_CONFIG, &d_add->flags, YIN_SUBELEM_UNIQUE},
            {LY_STMT_DEFAULT, &d_add->dflts, 0},
            {LY_STMT_MANDATORY, &d_add->flags, YIN_SUBELEM_UNIQUE},
            {LY_STMT_MAX_ELEMENTS, &max, YIN_SUBELEM_UNIQUE},
            {LY_STMT_MIN_ELEMENTS, &min, YIN_SUBELEM_UNIQUE},
            {LY_STMT_MUST, &d_add->musts, 0},
            {LY_STMT_UNIQUE, &d_add->uniques, 0},
            {LY_STMT_UNITS, &d_add->units, YIN_SUBELEM_UNIQUE},
            {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
        };

        ret = yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), d, LY_STMT_DEVIATE, NULL, &d->exts);

    } else if (dev_mod == LYS_DEV_REPLACE) {
        d_rpl = calloc(1, sizeof *d_rpl);
        LY_CHECK_ERR_RET(!d_rpl, LOGMEM(ctx->xmlctx->ctx), LY_EMEM);
        d = (struct lysp_deviate *)d_rpl;
        struct minmax_dev_meta min = {&d_rpl->min, &d_rpl->flags, &d_rpl->exts};
        struct minmax_dev_meta max = {&d_rpl->max, &d_rpl->flags, &d_rpl->exts};
        struct yin_subelement subelems[] = {
            {LY_STMT_CONFIG, &d_rpl->flags, YIN_SUBELEM_UNIQUE},
            {LY_STMT_DEFAULT, &d_rpl->dflt, YIN_SUBELEM_UNIQUE},
            {LY_STMT_MANDATORY, &d_rpl->flags, YIN_SUBELEM_UNIQUE},
            {LY_STMT_MAX_ELEMENTS, &max, YIN_SUBELEM_UNIQUE},
            {LY_STMT_MIN_ELEMENTS, &min, YIN_SUBELEM_UNIQUE},
            {LY_STMT_TYPE, &d_rpl->type, YIN_SUBELEM_UNIQUE},
            {LY_STMT_UNITS, &d_rpl->units, YIN_SUBELEM_UNIQUE},
            {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
        };

        ret = yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), d, LY_STMT_DEVIATE, NULL, &d->exts);

    } else {
        d_del = calloc(1, sizeof *d_del);
        LY_CHECK_ERR_RET(!d_del, LOGMEM(ctx->xmlctx->ctx), LY_EMEM);
        d = (struct lysp_deviate *)d_del;
        struct yin_subelement subelems[] = {
            {LY_STMT_DEFAULT, &d_del->dflts, 0},
            {LY_STMT_MUST, &d_del->musts, 0},
            {LY_STMT_UNIQUE, &d_del->uniques, 0},
            {LY_STMT_UNITS, &d_del->units, YIN_SUBELEM_UNIQUE},
            {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
        };

        ret = yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), d, LY_STMT_DEVIATE, NULL, &d->exts);
    }
    LY_CHECK_GOTO(ret, cleanup);

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_GOTO(ret = yin_unres_exts_add(ctx, d->exts), cleanup);

    d->mod = dev_mod;
    /* insert into siblings */
    LY_LIST_INSERT(deviates, d, next);

    return ret;

cleanup:
    free(d);
    return ret;
}